

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

int EVP_PKEY_copy_parameters(EVP_PKEY *to,EVP_PKEY *from)

{
  EVP_PKEY_ASN1_METHOD *pEVar1;
  code *UNRECOVERED_JUMPTABLE;
  int iVar2;
  int line;
  
  if (to->save_type == 0) {
    pEVar1 = from->ameth;
    if ((to->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
       (UNRECOVERED_JUMPTABLE = *(code **)(to->ameth + 0xa0), UNRECOVERED_JUMPTABLE != (code *)0x0))
    {
      (*UNRECOVERED_JUMPTABLE)(to);
      *(undefined8 *)&to->references = 0;
    }
    to->ameth = pEVar1;
    to->save_type = *(int *)pEVar1;
  }
  else if (to->save_type != from->save_type) {
    iVar2 = 0x67;
    line = 0x6e;
    goto LAB_00466288;
  }
  if (((from->ameth == (EVP_PKEY_ASN1_METHOD *)0x0) ||
      (UNRECOVERED_JUMPTABLE = *(code **)(from->ameth + 0x88), UNRECOVERED_JUMPTABLE == (code *)0x0)
      ) || (iVar2 = (*UNRECOVERED_JUMPTABLE)(from), iVar2 == 0)) {
    if (((to->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
        (UNRECOVERED_JUMPTABLE = *(code **)(to->ameth + 0x88), UNRECOVERED_JUMPTABLE != (code *)0x0)
        ) && (iVar2 = (*UNRECOVERED_JUMPTABLE)(to), iVar2 != 0)) {
      if (from->ameth == (EVP_PKEY_ASN1_METHOD *)0x0) {
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(from->ameth + 0x90);
      if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
        return 0;
      }
      iVar2 = (*UNRECOVERED_JUMPTABLE)(to,from);
      return iVar2;
    }
    if (((to->save_type == from->save_type) && (to->ameth != (EVP_PKEY_ASN1_METHOD *)0x0)) &&
       ((UNRECOVERED_JUMPTABLE = *(code **)(to->ameth + 0x98), UNRECOVERED_JUMPTABLE != (code *)0x0
        && (iVar2 = (*UNRECOVERED_JUMPTABLE)(to), iVar2 == 1)))) {
      return 1;
    }
    iVar2 = 0x68;
    line = 0x7c;
  }
  else {
    iVar2 = 0x76;
    line = 0x73;
  }
LAB_00466288:
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_PKEY_copy_parameters(EVP_PKEY *to, const EVP_PKEY *from) {
  if (to->type == EVP_PKEY_NONE) {
    evp_pkey_set_method(to, from->ameth);
  } else if (to->type != from->type) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_KEY_TYPES);
    return 0;
  }

  if (EVP_PKEY_missing_parameters(from)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }

  // Once set, parameters may not change.
  if (!EVP_PKEY_missing_parameters(to)) {
    if (EVP_PKEY_cmp_parameters(to, from) == 1) {
      return 1;
    }
    OPENSSL_PUT_ERROR(EVP, EVP_R_DIFFERENT_PARAMETERS);
    return 0;
  }

  if (from->ameth && from->ameth->param_copy) {
    return from->ameth->param_copy(to, from);
  }

  // TODO(https://crbug.com/boringssl/536): If the algorithm takes no
  // parameters, copying them should vacuously succeed.
  return 0;
}